

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

void __thiscall
iDynTree::KinDynComputations::KinDynComputationsPrivateAttributes::
processOnLeftSideBodyFixedBaseMomentumJacobian
          (KinDynComputationsPrivateAttributes *this,MatrixView<double> *jac)

{
  Transform *pTVar1;
  MatrixView<double> *in_RSI;
  long in_RDI;
  int cols;
  Matrix6x6 newOutputFrame_X_oldOutputFrame_;
  Transform *world_X_base;
  Transform newOutputFrame_X_oldOutputFrame;
  Rotation *in_stack_fffffffffffffc58;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false>_>
  *in_stack_fffffffffffffc70;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc84;
  Index in_stack_fffffffffffffc88;
  Index in_stack_fffffffffffffc90;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
  *in_stack_fffffffffffffc98;
  MatrixView<double> *in_stack_fffffffffffffca8;
  Position local_f0 [24];
  Transform local_d8 [96];
  undefined8 local_78;
  Transform local_70 [112];
  
  iDynTree::Transform::Transform(local_70);
  if (*(int *)(in_RDI + 4) != 1) {
    if (*(int *)(in_RDI + 4) == 2) {
      local_78 = iDynTree::FreeFloatingPos::worldBasePos();
      in_stack_fffffffffffffc58 = (Rotation *)iDynTree::Transform::getRotation();
      iDynTree::Position::Zero();
      iDynTree::Transform::Transform(local_d8,in_stack_fffffffffffffc58,local_f0);
      iDynTree::Transform::operator=(local_70,local_d8);
    }
    else {
      pTVar1 = (Transform *)iDynTree::FreeFloatingPos::worldBasePos();
      iDynTree::Transform::operator=(local_70,pTVar1);
    }
    iDynTree::Transform::asAdjointTransformWrench();
    MatrixView<double>::cols(in_RSI);
    toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffffc78);
    toEigen(in_stack_fffffffffffffca8);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<-1,-1>>>::
    block<int,int>(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                   in_stack_fffffffffffffc84,in_stack_fffffffffffffc80);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::operator*
              (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    toEigen(in_stack_fffffffffffffca8);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<-1,-1>>>::
    block<int,int>(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                   in_stack_fffffffffffffc84,in_stack_fffffffffffffc80);
    Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<-1,-1>>,-1,-1,false>
    ::operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false>
                 *)in_RSI,
                (DenseBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false>,_0>_>
                 *)in_stack_fffffffffffffc58);
  }
  return;
}

Assistant:

void KinDynComputations::KinDynComputationsPrivateAttributes::processOnLeftSideBodyFixedBaseMomentumJacobian(MatrixView<double> jac)
{
    Transform newOutputFrame_X_oldOutputFrame;
    if (m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        return;
    }
    else if (m_frameVelRepr == MIXED_REPRESENTATION)
    {
        Transform & world_X_base = m_pos.worldBasePos();
        newOutputFrame_X_oldOutputFrame = Transform(world_X_base.getRotation(),Position::Zero());
    }
    else
    {
        assert(m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);
        newOutputFrame_X_oldOutputFrame = m_pos.worldBasePos();
    }

    Matrix6x6 newOutputFrame_X_oldOutputFrame_ = newOutputFrame_X_oldOutputFrame.asAdjointTransformWrench();

    int cols = jac.cols();
    toEigen(jac).block(0,0,6,cols) = toEigen(newOutputFrame_X_oldOutputFrame_)*toEigen(jac).block(0,0,6,cols);
}